

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O1

_Bool read_stdin(void *buffer,size_t nbytes)

{
  uint __errnum;
  uint __fd;
  ssize_t sVar1;
  uint *puVar2;
  char *pcVar3;
  size_t sVar4;
  
  __fd = fileno(_stdin);
  sVar4 = 0;
  do {
    sVar1 = read(__fd,(void *)((long)buffer + sVar4),nbytes - sVar4);
    if (got_exit_signal != 0) {
      logmsg("signalled to die");
LAB_0010625d:
      sVar4 = 0xffffffffffffffff;
      goto LAB_00106277;
    }
    if (sVar1 < 0) {
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      if ((__errnum != 4) && (__errnum != 0xb)) {
        logmsg("reading from file descriptor: %d,",(ulong)__fd);
        pcVar3 = strerror(__errnum);
        logmsg("unrecoverable read() failure: (%d) %s",(ulong)__errnum,pcVar3);
        goto LAB_0010625d;
      }
    }
    else {
      if (sVar1 == 0) {
        sVar4 = 0;
        logmsg("got 0 reading from stdin");
        goto LAB_00106277;
      }
      sVar4 = sVar4 + sVar1;
    }
  } while (sVar4 < nbytes);
  if (verbose == '\x01') {
    logmsg("read %zd bytes",sVar4);
  }
LAB_00106277:
  if (sVar4 != nbytes) {
    logmsg("exiting...");
  }
  return sVar4 == nbytes;
}

Assistant:

static bool read_stdin(void *buffer, size_t nbytes)
{
  ssize_t nread = fullread(fileno(stdin), buffer, nbytes);
  if(nread != (ssize_t)nbytes) {
    logmsg("exiting...");
    return FALSE;
  }
  return TRUE;
}